

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathInterval.h
# Opt level: O3

ostream * Imath_3_2::operator<<(ostream *s,Interval<short> *v)

{
  ostream *poVar1;
  char local_b [3];
  
  local_b[0] = '(';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(s,local_b,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->min);
  local_b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,v->max);
  local_b[2] = 0x29;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b + 2,1);
  return poVar1;
}

Assistant:

std::ostream&
operator<< (std::ostream& s, const Interval<T>& v)
{
    return s << '(' << v.min << ' ' << v.max << ')';
}